

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void __thiscall
testing::anon_unknown_6::MockObjectRegistry::~MockObjectRegistry(MockObjectRegistry *this)

{
  bool bVar1;
  pointer ppVar2;
  ulong uVar3;
  ostream *poVar4;
  int in_ECX;
  char *pcVar5;
  string local_70;
  MockObjectState *local_50;
  MockObjectState *state;
  _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
  local_40;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
  local_30;
  const_iterator it;
  int leaked_count;
  MutexLock l;
  MockObjectRegistry *this_local;
  
  if ((FLAGS_gmock_catch_leaked_mocks & 1) == 0) {
    l.mutex_._4_4_ = 1;
  }
  else {
    internal::GTestMutexLock::GTestMutexLock
              ((GTestMutexLock *)&stack0xffffffffffffffe0,(MutexBase *)internal::g_gmock_mutex);
    it._M_node._4_4_ = 0;
    local_38._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
         ::begin(&this->states_);
    std::
    _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
    ::_Rb_tree_const_iterator(&local_30,&local_38);
    while( true ) {
      state = (MockObjectState *)
              std::
              map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
              ::end(&this->states_);
      std::
      _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
      ::_Rb_tree_const_iterator(&local_40,(iterator *)&state);
      bVar1 = std::operator!=(&local_30,&local_40);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
               ::operator->(&local_30);
      if (((ppVar2->second).leakable & 1U) == 0) {
        std::operator<<((ostream *)&std::cout,"\n");
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
                 ::operator->(&local_30);
        local_50 = &ppVar2->second;
        internal::FormatFileLocation_abi_cxx11_
                  (&local_70,(internal *)local_50->first_used_file,
                   (char *)(ulong)(uint)(ppVar2->second).first_used_line,in_ECX);
        std::operator<<((ostream *)&std::cout,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::operator<<((ostream *)&std::cout," ERROR: this mock object");
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          poVar4 = std::operator<<((ostream *)&std::cout," (used in test ");
          poVar4 = std::operator<<(poVar4,(string *)&local_50->first_used_test_suite);
          poVar4 = std::operator<<(poVar4,".");
          poVar4 = std::operator<<(poVar4,(string *)&local_50->first_used_test);
          std::operator<<(poVar4,")");
        }
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 " should be deleted but never is. Its address is @");
        ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
                 ::operator->(&local_30);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar2->first);
        std::operator<<(poVar4,".");
        it._M_node._4_4_ = it._M_node._4_4_ + 1;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>
      ::operator++(&local_30);
    }
    if (0 < it._M_node._4_4_) {
      poVar4 = std::operator<<((ostream *)&std::cout,"\nERROR: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,it._M_node._4_4_);
      poVar4 = std::operator<<(poVar4," leaked mock ");
      pcVar5 = "objects";
      if (it._M_node._4_4_ == 1) {
        pcVar5 = "object";
      }
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::operator<<(poVar4,
                      " found at program exit. Expectations on a mock object are verified when the object is destructed. Leaking a mock means that its expectations aren\'t verified, which is usually a test bug. If you really intend to leak a mock, you can suppress this error using testing::Mock::AllowLeak(mock_object), or you may use a fake or stub instead of a mock.\n"
                     );
      std::ostream::flush();
      std::ostream::flush();
      _Exit(1);
    }
    internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)&stack0xffffffffffffffe0);
    l.mutex_._4_4_ = 0;
  }
  std::
  map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
  ::~map(&this->states_);
  return;
}

Assistant:

~MockObjectRegistry() {
    if (!GMOCK_FLAG_GET(catch_leaked_mocks)) return;
    internal::MutexLock l(&internal::g_gmock_mutex);

    int leaked_count = 0;
    for (StateMap::const_iterator it = states_.begin(); it != states_.end();
         ++it) {
      if (it->second.leakable)  // The user said it's fine to leak this object.
        continue;

      // FIXME: Print the type of the leaked object.
      // This can help the user identify the leaked object.
      std::cout << "\n";
      const MockObjectState& state = it->second;
      std::cout << internal::FormatFileLocation(state.first_used_file,
                                                state.first_used_line);
      std::cout << " ERROR: this mock object";
      if (!state.first_used_test.empty()) {
        std::cout << " (used in test " << state.first_used_test_suite << "."
                  << state.first_used_test << ")";
      }
      std::cout << " should be deleted but never is. Its address is @"
                << it->first << ".";
      leaked_count++;
    }
    if (leaked_count > 0) {
      std::cout << "\nERROR: " << leaked_count << " leaked mock "
                << (leaked_count == 1 ? "object" : "objects")
                << " found at program exit. Expectations on a mock object are "
                   "verified when the object is destructed. Leaking a mock "
                   "means that its expectations aren't verified, which is "
                   "usually a test bug. If you really intend to leak a mock, "
                   "you can suppress this error using "
                   "testing::Mock::AllowLeak(mock_object), or you may use a "
                   "fake or stub instead of a mock.\n";
      std::cout.flush();
      ::std::cerr.flush();
      // RUN_ALL_TESTS() has already returned when this destructor is
      // called.  Therefore we cannot use the normal Google Test
      // failure reporting mechanism.
#ifdef GTEST_OS_QURT
      qurt_exception_raise_fatal();
#else
      _Exit(1);  // We cannot call exit() as it is not reentrant and
                 // may already have been called.
#endif
    }
  }